

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O1

int stbi__jpeg_get_bit(stbi__jpeg *j)

{
  uint uVar1;
  
  if (j->code_bits < 1) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->code_bits < 1) {
    uVar1 = 0;
  }
  else {
    uVar1 = j->code_buffer;
    j->code_buffer = uVar1 * 2;
    j->code_bits = j->code_bits + -1;
    uVar1 = uVar1 & 0x80000000;
  }
  return uVar1;
}

Assistant:

stbi_inline static int stbi__jpeg_get_bit(stbi__jpeg *j)
{
   unsigned int k;
   if (j->code_bits < 1) stbi__grow_buffer_unsafe(j);
   if (j->code_bits < 1) return 0; // ran out of bits from stream, return 0s intead of continuing
   k = j->code_buffer;
   j->code_buffer <<= 1;
   --j->code_bits;
   return k & 0x80000000;
}